

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlencode.c
# Opt level: O2

STRING_HANDLE URL_DecodeString(char *textDecode)

{
  STRING_HANDLE input;
  STRING_HANDLE pSVar1;
  
  if ((textDecode != (char *)0x0) &&
     (input = STRING_construct(textDecode), input != (STRING_HANDLE)0x0)) {
    pSVar1 = URL_Decode(input);
    STRING_delete(input);
    return pSVar1;
  }
  return (STRING_HANDLE)0x0;
}

Assistant:

STRING_HANDLE URL_DecodeString(const char* textDecode)
{
    STRING_HANDLE result;
    if (textDecode == NULL)
    {
        result = NULL;
    }
    else
    {
        STRING_HANDLE tempString = STRING_construct(textDecode);
        if (tempString == NULL)
        {
            result = NULL;
        }
        else
        {
            result = URL_Decode(tempString);
            STRING_delete(tempString);
        }
    }
    return result;
}